

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtrIdxLeaf(MemPage *pPage,u8 *pCell)

{
  uint uVar1;
  byte *pbVar2;
  bool local_29;
  int minLocal;
  u32 nSize;
  u8 *pEnd;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  nSize = (u32)*pCell;
  pIter = pCell;
  if (0x7f < nSize) {
    nSize = nSize & 0x7f;
    pIter = pCell;
    do {
      pbVar2 = pIter + 1;
      nSize = nSize << 7 | pIter[1] & 0x7f;
      local_29 = 0x7f < *pbVar2 && pbVar2 < pCell + 8;
      pIter = pbVar2;
    } while (local_29);
  }
  if (pPage->maxLocal < nSize) {
    uVar1 = (uint)pPage->minLocal;
    nSize = uVar1 + (nSize - uVar1) % (pPage->pBt->usableSize - 4);
    if (pPage->maxLocal < nSize) {
      nSize = uVar1;
    }
    nSize._0_2_ = ((short)(pIter + 1) - (short)pCell) + 4 + (short)nSize;
  }
  else {
    nSize = ((int)(pIter + 1) - (int)pCell) + nSize;
    if (nSize < 4) {
      nSize = 4;
    }
  }
  return (u16)nSize;
}

Assistant:

static u16 cellSizePtrIdxLeaf(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell;                       /* For looping over bytes of pCell */
  u8 *pEnd;                                /* End mark for a varint */
  u32 nSize;                               /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  assert( pPage->childPtrSize==0 );
  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==(u32)pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==(u32)pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}